

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void __thiscall
fmt::v8::detail::format_error_code
          (detail *this,buffer<char> *out,int error_code,string_view message)

{
  string_view fmt;
  string_view fmt_00;
  bool bVar1;
  int value;
  type tVar2;
  size_t sVar3;
  undefined4 in_register_00000014;
  basic_string_view<char> bVar4;
  anon_class_1_0_00000001 local_232;
  v8 local_231;
  int *local_230;
  size_t local_228;
  buffer<char> *local_220;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_218;
  anon_class_1_0_00000001 local_20a;
  v8 local_209;
  char (*local_208) [3];
  size_t local_200;
  buffer<char> *local_1f8;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_1f0;
  buffer_appender<char> it;
  long lStack_1e0;
  uint32_or_64_or_128_t<int> abs_value;
  size_t error_code_size;
  buffer<char> *pbStack_1d0;
  int error_code_local;
  buffer<char> *out_local;
  string_view message_local;
  format_args local_190;
  char (*local_180) [3];
  size_t local_178;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_170;
  char *local_168;
  v8 *local_160;
  char (*local_158) [3];
  size_t sStack_150;
  buffer<char> *local_148;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_140;
  v8 *local_138;
  char (**local_130) [3];
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> local_128;
  format_args local_108;
  int *local_f8;
  size_t local_f0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_e8;
  char (*local_e0) [7];
  char *local_d8;
  int *local_d0;
  size_t sStack_c8;
  buffer<char> *local_c0;
  back_insert_iterator<fmt::v8::detail::buffer<char>_> local_b8;
  v8 *local_b0;
  int **local_a8;
  char (**local_a0) [3];
  char (*local_98) [3];
  size_t sStack_90;
  size_t *local_80;
  format_args *local_78;
  size_t *local_70;
  undefined8 local_68;
  format_args *local_60;
  size_t *local_58;
  int **local_50;
  int *local_48;
  size_t sStack_40;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> *local_38;
  format_args *local_30;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> *local_28;
  undefined8 local_20;
  format_args *local_18;
  format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_char[7],_int> *local_10;
  
  out_local = (buffer<char> *)CONCAT44(in_register_00000014,error_code);
  message_local.data_ = message.data_;
  error_code_size._4_4_ = (uint32_t)out;
  pbStack_1d0 = (buffer<char> *)this;
  buffer<char>::try_resize((buffer<char> *)this,0);
  lStack_1e0 = 8;
  it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ =
       error_code_size._4_4_;
  bVar1 = is_negative<int,_0>(error_code_size._4_4_);
  if (bVar1) {
    it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_ =
         -it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_;
    lStack_1e0 = 9;
  }
  value = count_digits(it.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container._4_4_
                      );
  tVar2 = to_unsigned<int>(value);
  appender::back_insert_iterator((appender *)&local_1f0,pbStack_1d0);
  sVar3 = basic_string_view<char>::size((basic_string_view<char> *)&out_local);
  if (sVar3 <= 500 - (lStack_1e0 + (ulong)tVar2)) {
    local_1f8 = local_1f0.container;
    format_error_code::anon_class_1_0_00000001::operator()(&local_20a);
    local_130 = &local_208;
    local_138 = &local_209;
    bVar4 = v8::operator()(local_138);
    local_200 = bVar4.size_;
    local_208 = (char (*) [3])bVar4.data_;
    check_format_string<fmt::v8::basic_string_view<char>_&,_const_char_(&)[3],_FMT_COMPILE_STRING,_0>
              ();
    local_148 = local_1f8;
    local_158 = local_208;
    sStack_150 = local_200;
    local_160 = (v8 *)&out_local;
    local_168 = ": ";
    local_170.container = local_1f8;
    local_a0 = &local_158;
    local_180 = local_208;
    local_178 = local_200;
    local_98 = local_180;
    sStack_90 = local_178;
    make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,fmt::v8::basic_string_view<char>&,char_const(&)[3]>
              ((format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_fmt::v8::basic_string_view<char>,_char[3]>
                *)&message_local.size_,local_160,(basic_string_view<char> *)": ",local_208);
    local_78 = &local_190;
    local_80 = &message_local.size_;
    local_68 = 0xcd;
    local_190.desc_ = 0xcd;
    local_190.field_1.values_ =
         (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_80;
    fmt.size_ = local_178;
    fmt.data_ = *local_180;
    local_70 = local_80;
    local_60 = local_78;
    local_58 = local_80;
    local_218.container =
         (buffer<char> *)vformat_to<fmt::v8::appender,_0>(local_170.container,fmt,local_190);
    local_140.container = local_218.container;
  }
  local_220 = local_1f0.container;
  format_error_code::anon_class_1_0_00000001::operator()(&local_232);
  local_a8 = &local_230;
  local_b0 = &local_231;
  bVar4 = v8::operator()(local_b0);
  local_228 = bVar4.size_;
  local_230 = (int *)bVar4.data_;
  check_format_string<const_char_(&)[7],_int_&,_FMT_COMPILE_STRING,_0>();
  local_c0 = local_220;
  local_d0 = local_230;
  sStack_c8 = local_228;
  local_d8 = "error ";
  local_e0 = (char (*) [7])((long)&error_code_size + 4);
  local_e8.container = local_220;
  local_50 = &local_d0;
  local_f8 = local_230;
  local_f0 = local_228;
  local_48 = local_f8;
  sStack_40 = local_f0;
  make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,char_const(&)[7],int&>
            (&local_128,(v8 *)"error ",local_e0,local_230);
  local_30 = &local_108;
  local_38 = &local_128;
  local_20 = 0x1c;
  local_108.desc_ = 0x1c;
  local_108.field_1.values_ =
       (value<fmt::v8::basic_format_context<fmt::v8::appender,_char>_> *)local_38;
  fmt_00.size_ = local_f0;
  fmt_00.data_ = (char *)local_f8;
  local_28 = local_38;
  local_18 = local_30;
  local_10 = local_38;
  local_b8.container =
       (buffer<char> *)vformat_to<fmt::v8::appender,_0>(local_e8.container,fmt_00,local_108);
  sVar3 = buffer<char>::size(pbStack_1d0);
  if (500 < sVar3) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/tosinalagbe[P]hedg/include/fmt/format-inl.h"
                ,0x4c,"");
  }
  return;
}

Assistant:

FMT_FUNC void format_error_code(detail::buffer<char>& out, int error_code,
                                string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.try_resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  auto abs_value = static_cast<uint32_or_64_or_128_t<int>>(error_code);
  if (detail::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += detail::to_unsigned(detail::count_digits(abs_value));
  auto it = buffer_appender<char>(out);
  if (message.size() <= inline_buffer_size - error_code_size)
    format_to(it, FMT_STRING("{}{}"), message, SEP);
  format_to(it, FMT_STRING("{}{}"), ERROR_STR, error_code);
  FMT_ASSERT(out.size() <= inline_buffer_size, "");
}